

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O3

void __thiscall sf::priv::JoystickManager::JoystickManager(JoystickManager *this)

{
  bool *pbVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    JoystickImpl::JoystickImpl
              ((JoystickImpl *)(this->m_joysticks[0].joystick.m_mapping + lVar2 + -4));
    *(undefined1 *)((long)this->m_joysticks[0].state.axes + lVar2 + -4) = 0;
    *(undefined8 *)((long)this->m_joysticks[0].state.axes + lVar2) = 0;
    *(undefined8 *)((long)this->m_joysticks[0].state.axes + lVar2 + 8) = 0;
    *(undefined8 *)((long)this->m_joysticks[0].state.axes + lVar2 + 0x10) = 0;
    *(undefined8 *)((long)this->m_joysticks[0].state.axes + lVar2 + 0x18) = 0;
    pbVar1 = this->m_joysticks[0].state.buttons + lVar2;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1 = this->m_joysticks[0].state.buttons + lVar2 + 8;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1 = this->m_joysticks[0].state.buttons + lVar2 + 0x10;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1 = this->m_joysticks[0].state.buttons + lVar2 + 0x18;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1 = this->m_joysticks[0].state.buttons + lVar2 + 0x1c;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1 = this->m_joysticks[0].capabilities.axes + lVar2;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    Joystick::Identification::Identification
              ((Identification *)
               ((long)&(((Identification *)(&this->m_joysticks[0].capabilities + 1))->name).m_string
                       ._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + 0x128;
  } while (lVar2 != 0x940);
  JoystickImpl::initialize();
  return;
}

Assistant:

JoystickManager::JoystickManager()
{
    JoystickImpl::initialize();
}